

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O1

void ixy::info<ixy::Pair<ixy::Pair<ixy::None,char_const*>,std::__cxx11::string_const&>>
               (char *file,int line,char *function,
               LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
               *data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[INFO ] ",8);
  if (file == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1141b0);
  }
  else {
    sVar2 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,file,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (function == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(function);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,function,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(): ",4);
  printList<ixy::None,char_const*>((ostream *)&std::cout,(Pair<ixy::None,_const_char_*> *)data);
  pbVar1 = (data->list).second;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void info(const char *file, int line, const char *function, const LogData<List> &data) {
    std::cout << "[INFO ] " << file << ":" << line << " " << function << "(): ";
    printList(std::cout, data.list);
    std::cout << std::endl;
}